

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O2

void __thiscall FileBuffer::loadSegment(FileBuffer *this,int segment,int loadToPosition)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  ifstream *this_00;
  long lVar5;
  
  iVar1 = this->_fileSegmentLength;
  iVar2 = -1;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  pvVar4 = operator_new__((long)iVar2);
  this_00 = (ifstream *)operator_new(0x208);
  std::ifstream::ifstream(this_00);
  std::ifstream::open((char *)this_00,(_Ios_Openmode)this->_file);
  std::istream::seekg((long)this_00,iVar1 * segment);
  std::istream::read((char *)this_00,(long)pvVar4);
  iVar1 = *(int *)(this_00 + 8);
  std::ifstream::close();
  iVar2 = this->_fileSegmentLength;
  iVar3 = iVar2 * loadToPosition;
  for (lVar5 = 0; (lVar5 < iVar1 && (lVar5 < iVar2)); lVar5 = lVar5 + 1) {
    this->_buffer[lVar5 + iVar3] = *(char *)((long)pvVar4 + lVar5);
    iVar2 = this->_fileSegmentLength;
  }
  this->_loadedSegments[loadToPosition] = segment;
  operator_delete__(pvVar4);
  return;
}

Assistant:

void FileBuffer::loadSegment(int segment, int loadToPosition) {
    //printf("Loading segment %d to position %d\n", segment, loadToPosition);
    //char **actualPosition = (char **) (&_buffer + (_fileSegmentLength * loadToPosition));



    int fileSegmentStartPos = segment * _fileSegmentLength;
    char *innerBuffer = new char[_fileSegmentLength];

    ifstream *fileStream = new ifstream();
    fileStream->open(_file);
    fileStream->seekg(fileSegmentStartPos, ios::beg);
    fileStream->read(innerBuffer, _fileSegmentLength);
    int readChars = (int) fileStream->gcount();
    fileStream->close();

    int bufferIndexStart = _fileSegmentLength * loadToPosition;

    for (int i = 0; i < _fileSegmentLength && i < readChars; i++) {
        _buffer[bufferIndexStart + i] = innerBuffer[i];
    }

    _loadedSegments[loadToPosition] = segment;

    delete[] innerBuffer;
}